

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void __thiscall
DWallLightTransfer::DWallLightTransfer
          (DWallLightTransfer *this,sector_t *srcSec,int target,BYTE flags)

{
  BYTE *pBVar1;
  short lightlevel;
  uint uVar2;
  byte bVar3;
  FLineIdIterator itr;
  FLineIdIterator local_30;
  
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007014d8;
  this->Source = srcSec;
  this->TargetID = target;
  this->Flags = flags;
  lightlevel = srcSec->lightlevel;
  this->LastLight = lightlevel;
  DoTransfer(lightlevel,target,flags);
  bVar3 = (flags & 4) + 1;
  local_30.start = tagManager.IDHashFirst[target & 0xff];
  local_30.searchtag = target;
  while( true ) {
    uVar2 = FLineIdIterator::Next(&local_30);
    if ((int)uVar2 < 0) break;
    if (((flags & 1) != 0) && (lines[uVar2].sidedef[0] != (side_t *)0x0)) {
      pBVar1 = &lines[uVar2].sidedef[0]->Flags;
      *pBVar1 = *pBVar1 | bVar3;
    }
    if (((flags & 2) != 0) && (lines[uVar2].sidedef[1] != (side_t *)0x0)) {
      pBVar1 = &lines[uVar2].sidedef[1]->Flags;
      *pBVar1 = *pBVar1 | bVar3;
    }
  }
  DThinker::ChangeStatNum(&this->super_DThinker,0x27);
  return;
}

Assistant:

DWallLightTransfer::DWallLightTransfer (sector_t *srcSec, int target, BYTE flags)
{
	int linenum;
	int wallflags;

	Source = srcSec;
	TargetID = target;
	Flags = flags;
	DoTransfer (LastLight = srcSec->GetLightLevel(), target, Flags);

	if (!(flags & WLF_NOFAKECONTRAST))
	{
		wallflags = WALLF_ABSLIGHTING;
	}
	else
	{
		wallflags = WALLF_ABSLIGHTING | WALLF_NOFAKECONTRAST;
	}

	FLineIdIterator itr(target);
	while ((linenum = itr.Next()) >= 0)
	{
		if (flags & WLF_SIDE1 && lines[linenum].sidedef[0] != NULL)
		{
			lines[linenum].sidedef[0]->Flags |= wallflags;
		}

		if (flags & WLF_SIDE2 && lines[linenum].sidedef[1] != NULL)
		{
			lines[linenum].sidedef[1]->Flags |= wallflags;
		}
	}
	ChangeStatNum(STAT_LIGHTTRANSFER);
}